

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_level.cpp
# Opt level: O1

void Cmd_map(FCommandLine *argv,APlayerPawn *who,int key)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  
  if (netgame) {
    pcVar3 = "Use \x1c+changemap\x1c- instead. \x1c+Map\x1c- is for single-player only.\n";
LAB_0038c710:
    Printf(pcVar3);
    return;
  }
  iVar2 = FCommandLine::argc(argv);
  if (iVar2 < 2) {
    pcVar3 = "Usage: map <map name> [coop|dm]\n";
    goto LAB_0038c710;
  }
  pcVar3 = FCommandLine::operator[](argv,1);
  bVar1 = P_CheckMapData(pcVar3);
  if (!bVar1) {
    pcVar3 = FCommandLine::operator[](argv,1);
    Printf("No map %s\n",pcVar3);
    return;
  }
  iVar2 = FCommandLine::argc(argv);
  if (iVar2 < 3) {
LAB_0038c6c0:
    iVar2 = FCommandLine::argc(argv);
    if (iVar2 < 3) goto LAB_0038c755;
    pcVar3 = FCommandLine::operator[](argv,2);
    iVar2 = strcasecmp(pcVar3,"dm");
    if (iVar2 != 0) goto LAB_0038c755;
    FBaseCVar::SetGenericRep(&deathmatch.super_FBaseCVar,(UCVarValue)0x1,CVAR_Int);
  }
  else {
    pcVar3 = FCommandLine::operator[](argv,2);
    iVar2 = strcasecmp(pcVar3,"coop");
    if (iVar2 != 0) goto LAB_0038c6c0;
    FBaseCVar::SetGenericRep(&deathmatch.super_FBaseCVar,(UCVarValue)0x0,CVAR_Int);
  }
  multiplayernext = true;
LAB_0038c755:
  pcVar3 = FCommandLine::operator[](argv,1);
  FString::operator=(&d_mapname,pcVar3);
  d_skill = -1;
  CheckWarpTransMap(&d_mapname,true);
  gameaction = ga_newgame2;
  return;
}

Assistant:

CCMD (map)
{
	if (netgame)
	{
		Printf ("Use " TEXTCOLOR_BOLD "changemap" TEXTCOLOR_NORMAL " instead. " TEXTCOLOR_BOLD "Map"
				TEXTCOLOR_NORMAL " is for single-player only.\n");
		return;
	}
	if (argv.argc() > 1)
	{
		try
		{
			if (!P_CheckMapData(argv[1]))
			{
				Printf ("No map %s\n", argv[1]);
			}
			else
			{
				if (argv.argc() > 2 && stricmp(argv[2], "coop") == 0)
				{
					deathmatch = false;
					multiplayernext = true;
				}
				else if (argv.argc() > 2 && stricmp(argv[2], "dm") == 0)
				{
					deathmatch = true;
					multiplayernext = true;
				}
				G_DeferedInitNew (argv[1]);
			}
		}
		catch(CRecoverableError &error)
		{
			if (error.GetMessage())
				Printf("%s", error.GetMessage());
		}
	}
	else
	{
		Printf ("Usage: map <map name> [coop|dm]\n");
	}
}